

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError set_rate(GlobalConfig *global,char *nextarg)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ParameterError PVar4;
  int iVar5;
  ParameterError PVar6;
  ulong uVar7;
  long lVar8;
  size_t __n;
  curl_off_t numunits;
  char *div;
  long denominator;
  char number [26];
  curl_off_t local_60;
  byte *local_58;
  long local_50;
  char local_48 [40];
  
  local_58 = (byte *)strchr(nextarg,0x2f);
  if (local_58 == (byte *)0x0) {
    __n = strlen(nextarg);
  }
  else {
    __n = (long)local_58 - (long)nextarg;
  }
  if (0x19 < __n) {
    return PARAM_NUMBER_TOO_LARGE;
  }
  memcpy(local_48,nextarg,__n);
  local_48[__n] = '\0';
  PVar4 = str2unum(&local_50,local_48);
  if (PVar4 != PARAM_OK) {
    return PVar4;
  }
  if (local_50 < 1) {
    return PARAM_BAD_USE;
  }
  if (local_58 == (byte *)0x0) {
    lVar8 = 3600000;
    PVar4 = PARAM_OK;
    goto LAB_0011277d;
  }
  local_58 = local_58 + 1;
  iVar5 = Curl_str_number((char **)&local_58,&local_60,0x7fffffffffffffff);
  if (iVar5 != 0) {
    local_60 = 1;
  }
  bVar1 = *local_58;
  uVar7 = 3600000;
  PVar6 = PARAM_OK;
  PVar4 = PARAM_OK;
  if (bVar1 < 0x6d) {
    if (bVar1 == 100) {
      uVar7 = 86400000;
      PVar4 = PVar6;
    }
    else {
      PVar4 = PVar6;
      if (bVar1 != 0x68) {
LAB_00112725:
        errorf(global,"unsupported --rate unit");
        PVar4 = PARAM_BAD_USE;
      }
    }
  }
  else if (bVar1 == 0x6d) {
    uVar7 = 60000;
  }
  else {
    if (bVar1 != 0x73) goto LAB_00112725;
    uVar7 = 1000;
    PVar4 = PVar6;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
  if (SUB168(auVar3 / auVar2,0) < local_60) {
    errorf(global,"too large --rate unit",SUB168(auVar3 % auVar2,0));
    PVar4 = PARAM_NUMBER_TOO_LARGE;
  }
  lVar8 = uVar7 * local_60;
LAB_0011277d:
  if ((PVar4 == PARAM_OK) && (PVar4 = PARAM_NUMBER_TOO_LARGE, local_50 <= lVar8)) {
    global->ms_per_transfer = lVar8 / local_50;
    PVar4 = PARAM_OK;
  }
  return PVar4;
}

Assistant:

static ParameterError set_rate(struct GlobalConfig *global,
                               const char *nextarg)
{
  /* --rate */
  /* support a few different suffixes, extract the suffix first, then
     get the number and convert to per hour.
     /s == per second
     /m == per minute
     /h == per hour (default)
     /d == per day (24 hours)
  */
  ParameterError err = PARAM_OK;
  const char *div = strchr(nextarg, '/');
  char number[26];
  long denominator;
  long numerator = 60*60*1000; /* default per hour */
  size_t numlen = div ? (size_t)(div - nextarg) : strlen(nextarg);
  if(numlen > sizeof(number) -1)
    return PARAM_NUMBER_TOO_LARGE;

  memcpy(number, nextarg, numlen);
  number[numlen] = 0;
  err = str2unum(&denominator, number);
  if(err)
    return err;

  if(denominator < 1)
    return PARAM_BAD_USE;

  if(div) {
    curl_off_t numunits;
    div++;

    if(curlx_str_number(&div, &numunits, CURL_OFF_T_MAX))
      numunits = 1;

    switch(*div) {
    case 's': /* per second */
      numerator = 1000;
      break;
    case 'm': /* per minute */
      numerator = 60*1000;
      break;
    case 'h': /* per hour */
      break;
    case 'd': /* per day */
      numerator = 24*60*60*1000;
      break;
    default:
      errorf(global, "unsupported --rate unit");
      err = PARAM_BAD_USE;
      break;
    }

    if((LONG_MAX / numerator) < numunits) {
      /* overflow, too large number */
      errorf(global, "too large --rate unit");
      err = PARAM_NUMBER_TOO_LARGE;
    }
    /* this typecast is okay based on the check above */
    numerator *= (long)numunits;
  }

  if(err)
    ;
  else if(denominator > numerator)
    err = PARAM_NUMBER_TOO_LARGE;
  else
    global->ms_per_transfer = numerator/denominator;

  return err;
}